

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O3

void __thiscall
t_cpp_generator::generate_assignment_helper
          (t_cpp_generator *this,ostream *out,t_struct *tstruct,bool is_move)

{
  int *piVar1;
  byte bVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar5;
  bool move;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  t_cpp_generator *this_00;
  pointer pptVar8;
  long *plVar9;
  size_type *psVar10;
  long lVar11;
  pointer pptVar12;
  string tmp_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_d0;
  string local_b0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"other","");
  t_generator::tmp(&local_90,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var,iVar6))[1]);
  pcVar3 = " & ";
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"& ",2);
  iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,*(char **)CONCAT44(extraout_var_00,iVar6),
                      ((undefined8 *)CONCAT44(extraout_var_00,iVar6))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"::operator=(",0xc);
  if (is_move) {
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_01,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_01,iVar6))[1]);
    lVar11 = 3;
    pcVar3 = " && ";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,"const ",6);
    iVar6 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,*(char **)CONCAT44(extraout_var_02,iVar6),
                        ((undefined8 *)CONCAT44(extraout_var_02,iVar6))[1]);
    lVar11 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar3 + 1,lVar11);
  this_00 = (t_cpp_generator *)
            std::__ostream_insert<char,std::char_traits<char>>
                      (out,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,") ",2);
  if (!is_move) {
    bVar5 = is_struct_storage_not_throwing(this_00,tstruct);
    if (!bVar5) goto LAB_001868e3;
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"noexcept ",9);
LAB_001868e3:
  std::__ostream_insert<char,std::char_traits<char>>(out,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar12 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (pptVar12 == pptVar8) {
    poVar7 = t_generator::indent((t_generator *)this,out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(void) ",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_90._M_dataplus._M_p,local_90._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    pptVar12 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    pptVar8 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  if (pptVar12 != pptVar8) {
    bVar4 = 0;
    do {
      bVar2 = bVar4;
      bVar5 = (*pptVar12)->req_ != T_REQUIRED;
      poVar7 = t_generator::indent((t_generator *)this,out);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,((*pptVar12)->name_)._M_dataplus._M_p,
                          ((*pptVar12)->name_)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_70,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      std::__cxx11::string::append((char *)local_70);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_70,(ulong)((*pptVar12)->name_)._M_dataplus._M_p);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      psVar10 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0.field_2._8_8_ = plVar9[3];
      }
      else {
        local_d0.field_2._M_allocated_capacity = *psVar10;
        local_d0._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_d0._M_string_length = plVar9[1];
      *plVar9 = (long)psVar10;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      if (is_move) {
        move = is_complex_type(this,(*pptVar12)->type_);
      }
      else {
        move = false;
      }
      anon_unknown.dwarf_2220f0::maybeMove(&local_b0,&local_d0,move);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
      if (local_70[0] != local_60) {
        operator_delete(local_70[0]);
      }
      pptVar12 = pptVar12 + 1;
      bVar4 = bVar2 | bVar5;
    } while (pptVar12 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    if ((bool)(bVar2 | bVar5)) {
      poVar7 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,"__isset = ",10);
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_d0,local_90._M_dataplus._M_p,
                 local_90._M_dataplus._M_p + local_90._M_string_length);
      std::__cxx11::string::append((char *)&local_d0);
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_b0,local_d0._M_dataplus._M_p,
                 local_d0._M_dataplus._M_p + local_d0._M_string_length);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_b0._M_dataplus._M_p,local_b0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p);
      }
    }
  }
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return *this;",0xd);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  poVar7 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_cpp_generator::generate_assignment_helper(ostream& out, t_struct* tstruct, bool is_move) {
  std::string tmp_name = tmp("other");

  indent(out) << tstruct->get_name() << "& " << tstruct->get_name() << "::operator=(";

  if (is_move) {
    out << tstruct->get_name() << "&& ";
  } else {
    out << "const " << tstruct->get_name() << "& ";
  }
  out << tmp_name << ") ";
  if(is_move || is_struct_storage_not_throwing(tstruct))
    out << "noexcept ";
  out << "{" << endl;
  indent_up();

  const vector<t_field*>& members = tstruct->get_members();

  // eliminate compiler unused warning
  if (members.empty())
    indent(out) << "(void) " << tmp_name << ";" << endl;

  vector<t_field*>::const_iterator f_iter;
  bool has_nonrequired_fields = false;
  for (f_iter = members.begin(); f_iter != members.end(); ++f_iter) {
    if ((*f_iter)->get_req() != t_field::T_REQUIRED)
      has_nonrequired_fields = true;
    indent(out) << (*f_iter)->get_name() << " = "
                << maybeMove(
                    tmp_name + "." + (*f_iter)->get_name(), 
                    is_move && is_complex_type((*f_iter)->get_type()))
                << ";" << endl;
  }
  if (has_nonrequired_fields) {
    indent(out) << "__isset = " << maybeMove(tmp_name + ".__isset", false) << ";" << endl;
  }

  indent(out) << "return *this;" << endl;
  indent_down();
  indent(out) << "}" << endl;
}